

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O1

void __thiscall bdQueryHistory::cleanupOldMsgs(bdQueryHistory *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  bool bVar3;
  time_t tVar4;
  _Base_ptr p_Var5;
  iterator tit;
  const_iterator __position;
  
  if (this->mStorePeriod != 0) {
    tVar4 = time((time_t *)0x0);
    __position._M_node = (this->mHistory)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->mHistory)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      iVar2 = this->mStorePeriod;
      do {
        bVar3 = bdQueryHistoryList::cleanupMsgs
                          ((bdQueryHistoryList *)&__position._M_node[2]._M_parent,tVar4 - iVar2);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        if (bVar3) {
          std::
          _Rb_tree<bdId,_std::pair<const_bdId,_bdQueryHistoryList>,_std::_Select1st<std::pair<const_bdId,_bdQueryHistoryList>_>,_std::less<bdId>,_std::allocator<std::pair<const_bdId,_bdQueryHistoryList>_>_>
          ::_M_erase_aux(&(this->mHistory)._M_t,__position);
        }
        __position._M_node = p_Var5;
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
  }
  return;
}

Assistant:

void bdQueryHistory::cleanupOldMsgs() {
	if (mStorePeriod == 0)
		return; // no cleanup.

	time_t before = time(NULL) - mStorePeriod;
	std::map<bdId, bdQueryHistoryList>::iterator it;
	for (it = mHistory.begin(); it != mHistory.end(); ) {
		if (it->second.cleanupMsgs(before)) {
			std::map<bdId, bdQueryHistoryList>::iterator tit(it);
			++tit;
			mHistory.erase(it);
			it = tit;
		} else
            ++it;
	}
}